

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

deUint64 deqp::gles3::Performance::anon_unknown_1::medianTimeMemcpy
                   (void *dst,void *src,int numBytes)

{
  uint *puVar1;
  deUint64 dVar2;
  deUint64 dVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  int sectionStarts [6];
  int sectionLens [5];
  deUint64 sectionTimes [5];
  undefined8 uStack_a0;
  uint local_98 [7];
  int aiStack_7c [9];
  ulong local_58;
  ulong auStack_50 [4];
  
  if (numBytes < 0x100000) {
    uStack_a0 = 0x1312a05;
    deYield();
    uStack_a0 = 0x1312a0a;
    dVar2 = deGetMicroseconds();
    uStack_a0 = 0x1312a1b;
    memcpy(dst,src,(long)numBytes);
    uStack_a0 = 0x1312a20;
    dVar3 = deGetMicroseconds();
    dVar3 = dVar3 - dVar2;
  }
  else {
    lVar5 = 1;
    iVar6 = 0;
    auVar10 = _DAT_019fcc00;
    do {
      if (SUB164(auVar10 ^ _DAT_019f5ce0,4) == -0x80000000 &&
          SUB164(auVar10 ^ _DAT_019f5ce0,0) < -0x7ffffffb) {
        *(uint *)((long)&uStack_a0 + lVar5 * 4 + 4) = iVar6 / 5 + 0xfU & 0xfffffff0;
        local_98[lVar5] = (numBytes + iVar6) / 5 + 0xfU & 0xfffffff0;
      }
      lVar7 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar7 + 2;
      lVar5 = lVar5 + 2;
      iVar6 = iVar6 + numBytes * 2;
    } while (lVar5 != 7);
    local_98[5] = numBytes;
    lVar5 = 1;
    uVar4 = local_98[0];
    do {
      puVar1 = local_98 + lVar5;
      aiStack_7c[lVar5] = *puVar1 - uVar4;
      lVar5 = lVar5 + 1;
      uVar4 = *puVar1;
    } while (lVar5 != 6);
    uStack_a0 = 0x1312b10;
    deYield();
    uStack_a0 = 0x1312b15;
    tcu::warmupCPU();
    uStack_a0 = 0x1312b1a;
    deYield();
    uStack_a0 = 0x1312b1f;
    dVar3 = deGetMicroseconds();
    uStack_a0 = 0x1312b37;
    memcpy((void *)((long)dst + (long)(int)local_98[0]),(void *)((long)(int)local_98[0] + (long)src)
           ,(long)aiStack_7c[1]);
    uStack_a0 = 0x1312b3c;
    dVar2 = deGetMicroseconds();
    uVar8 = dVar2 - dVar3;
    lVar5 = 0;
    uVar9 = uVar8;
    local_58 = uVar8;
    do {
      if ((float)uVar9 * 1.5 < (float)uVar8) {
        uStack_a0 = 0x1312baf;
        deYield();
        uStack_a0 = 0x1312bb4;
        tcu::warmupCPU();
        uStack_a0 = 0x1312bb9;
        deYield();
      }
      uStack_a0 = 0x1312bbe;
      dVar3 = deGetMicroseconds();
      lVar7 = (long)*(int *)((long)local_98 + lVar5 + 4);
      uStack_a0 = 0x1312bd7;
      memcpy((void *)((long)dst + lVar7),(void *)(lVar7 + (long)src),
             (long)*(int *)((long)aiStack_7c + lVar5 + 8));
      uStack_a0 = 0x1312bdc;
      dVar2 = deGetMicroseconds();
      uVar8 = dVar2 - dVar3;
      *(ulong *)((long)auStack_50 + lVar5 * 2) = uVar8;
      if (uVar8 <= uVar9 - 1) {
        uVar9 = uVar8;
      }
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x10);
    uStack_a0 = 0x1312c0e;
    std::__insertion_sort<unsigned_long*,__gnu_cxx::__ops::_Iter_less_iter>
              (&local_58,&stack0xffffffffffffffd0);
    dVar3 = auStack_50[1] * 5;
  }
  return dVar3;
}

Assistant:

static deUint64 medianTimeMemcpy (void* dst, const void* src, int numBytes)
{
	// Time used by memcpy is assumed to be asymptotically linear

	// With large numBytes, the probability of context switch or other random
	// event is high. Apply memcpy in parts and report how much time would
	// memcpy have used with the median transfer rate.

	// Less than 1MiB, no need to do anything special
	if (numBytes < 1048576)
	{
		deUint64 startTime;
		deUint64 endTime;

		deYield();

		startTime = deGetMicroseconds();
		deMemcpy(dst, src, numBytes);
		endTime = deGetMicroseconds();

		return endTime - startTime;
	}
	else
	{
		// Do memcpy in multiple parts

		const int	numSections		= 5;
		const int	sectionAlign	= 16;

		int			sectionStarts[numSections+1];
		int			sectionLens[numSections];
		deUint64	sectionTimes[numSections];
		deUint64	medianTime;
		deUint64	bestTime		= 0;

		for (int sectionNdx = 0; sectionNdx < numSections; ++sectionNdx)
			sectionStarts[sectionNdx] = deAlign32((numBytes * sectionNdx / numSections), sectionAlign);
		sectionStarts[numSections] = numBytes;

		for (int sectionNdx = 0; sectionNdx < numSections; ++sectionNdx)
			sectionLens[sectionNdx] = sectionStarts[sectionNdx+1] - sectionStarts[sectionNdx];

		// Memcpy is usually called after mapbuffer range which may take
		// a lot of time. To prevent power management from kicking in during
		// copy, warm up more.
		{
			deYield();
			tcu::warmupCPU();
			deYield();
		}

		for (int sectionNdx = 0; sectionNdx < numSections; ++sectionNdx)
		{
			deUint64 startTime;
			deUint64 endTime;

			startTime = deGetMicroseconds();
			deMemcpy((deUint8*)dst + sectionStarts[sectionNdx], (const deUint8*)src + sectionStarts[sectionNdx], sectionLens[sectionNdx]);
			endTime = deGetMicroseconds();

			sectionTimes[sectionNdx] = endTime - startTime;

			if (!bestTime || sectionTimes[sectionNdx] < bestTime)
				bestTime = sectionTimes[sectionNdx];

			// Detect if write takes 50% longer than it should, and warm up if that happened
			if (sectionNdx != numSections-1 && (float)sectionTimes[sectionNdx] > 1.5f * (float)bestTime)
			{
				deYield();
				tcu::warmupCPU();
				deYield();
			}
		}

		std::sort(sectionTimes, sectionTimes + numSections);

		if ((numSections % 2) == 0)
			medianTime = (sectionTimes[numSections / 2 - 1] + sectionTimes[numSections / 2]) / 2;
		else
			medianTime = sectionTimes[numSections / 2];

		return medianTime*numSections;
	}
}